

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_client.cpp
# Opt level: O0

int __thiscall
cppcms::impl::tcp_cache::fetch
          (tcp_cache *this,string *key,string *a,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tags,time_t *timeout,uint64_t *generation,bool transfer_if_not_updated)

{
  messenger *this_00;
  value_type *__x;
  size_t sVar1;
  long in_RCX;
  char *in_RDX;
  string *in_RSI;
  time_t *in_R8;
  undefined8 *in_R9;
  byte in_stack_00000008;
  uint tmp_len;
  string tag;
  int len;
  char *ptr;
  tcp_operation_header h;
  string data;
  string *in_stack_00000130;
  tcp_operation_header *in_stack_00000138;
  messenger *in_stack_00000140;
  string *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  string local_c8 [36];
  int local_a4;
  char *local_a0;
  undefined4 local_98;
  int local_88;
  undefined4 local_84;
  undefined8 local_78;
  undefined4 local_70;
  uint uStack_6c;
  uint local_68;
  int local_64;
  string local_60 [39];
  byte local_39;
  undefined8 *local_38;
  time_t *local_30;
  long local_28;
  char *local_20;
  int local_4;
  
  local_39 = in_stack_00000008 & 1;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  std::__cxx11::string::string(local_60,in_RSI);
  memset(&local_88,0,0x28);
  local_88 = 0;
  local_84 = std::__cxx11::string::size();
  local_70 = std::__cxx11::string::size();
  if ((local_39 & 1) != 0) {
    uStack_6c = uStack_6c & 0xfffffffd | 2;
    local_78 = *local_38;
  }
  if (local_28 != 0) {
    uStack_6c = uStack_6c & 0xfffffffe | 1;
  }
  this_00 = tcp_connector::get((tcp_connector *)
                               CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                               in_stack_fffffffffffffee8);
  messenger::transmit(in_stack_00000140,in_stack_00000138,in_stack_00000130);
  if (((local_39 & 1) == 0) || (local_88 != 9)) {
    if (local_88 == 7) {
      __x = (value_type *)to_time_t(CONCAT44(uStack_6c,local_70));
      *local_30 = (time_t)__x;
      *local_38 = local_78;
      local_a0 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::string::assign(local_20,(ulong)local_a0);
      local_a0 = (char *)((long)local_a0 + (ulong)local_68);
      local_a4 = local_64;
      while (0 < local_a4) {
        std::__cxx11::string::string(local_c8);
        sVar1 = strlen(local_a0);
        std::__cxx11::string::assign((char *)local_c8,(ulong)local_a0);
        local_a0 = local_a0 + ((uint)sVar1 + 1);
        local_a4 = ~(uint)sVar1 + local_a4;
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00,__x);
        std::__cxx11::string::~string(local_c8);
      }
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = -1;
  }
  local_98 = 1;
  std::__cxx11::string::~string(local_60);
  return local_4;
}

Assistant:

int tcp_cache::fetch(	std::string const &key,
			std::string &a,
			std::set<std::string> *tags,
			time_t &timeout,
			uint64_t &generation,
			bool transfer_if_not_updated) 
{
	std::string data=key;
	tcp_operation_header h=tcp_operation_header();
	h.opcode=opcodes::fetch;
	h.size=data.size();
	h.operations.fetch.key_len=data.size();
	
	if(transfer_if_not_updated) {
		h.operations.fetch.transfer_if_not_uptodate=1;
		h.operations.fetch.current_gen=generation;
	}
	
	if(tags)
		h.operations.fetch.transfer_triggers = 1;

	get(key).transmit(h,data);

	if(transfer_if_not_updated && h.opcode==opcodes::uptodate)
		return up_to_date;
	if(h.opcode!=opcodes::data)
		return not_found;

	timeout = to_time_t(h.operations.data.timeout);
	
	generation=h.operations.data.generation;

	char const *ptr=data.c_str();

	a.assign(ptr,h.operations.data.data_len);
	ptr+=h.operations.data.data_len;

	int len=h.operations.data.triggers_len;
	while(len>0) {
		std::string tag;
		unsigned tmp_len=strlen(ptr);
		tag.assign(ptr,tmp_len);
		ptr+=tmp_len+1;
		len-=tmp_len+1;
		tags->insert(tag);
	}
	return found;
}